

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O1

void NJDNode_load(NJDNode *node,char *str)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  byte *__s;
  byte bVar11;
  NJDNode *node2;
  char buff [1024];
  char buff_acc [1024];
  char buff_pron [1024];
  char buff_read [1024];
  char buff_orig [1024];
  char buff_string [1024];
  int local_1848;
  int local_1844;
  int local_1840;
  int local_183c;
  short local_1838 [512];
  byte local_1438 [1024];
  byte local_1038 [1024];
  byte local_c38 [1024];
  byte local_838 [1024];
  char local_438 [1032];
  
  bVar11 = *str;
  uVar7 = (ulong)bVar11;
  uVar6 = (uint)bVar11;
  if (bVar11 != 0) {
    uVar8 = 0;
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      do {
        local_438[uVar8] = (char)uVar7;
        bVar11 = str[uVar8 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (uint)(bVar11 == 0x2c) + (int)uVar8;
  }
  local_438[uVar7] = '\0';
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_pos(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_pos_group1(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_pos_group2(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_pos_group3(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_ctype(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_cform(node,(char *)local_1838);
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        local_838[uVar8] = (byte)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  local_838[uVar7] = 0;
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        local_c38[uVar8] = (byte)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  local_c38[uVar7] = 0;
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        local_1038[uVar8] = (byte)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  local_1038[uVar7] = 0;
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        local_1438[uVar8] = (byte)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  local_1438[uVar7] = 0;
  bVar11 = str[(int)uVar6];
  uVar7 = (ulong)bVar11;
  if (bVar11 != 0) {
    if (bVar11 == 0x2c) {
      uVar7 = 0;
      bVar11 = 0x2c;
    }
    else {
      uVar8 = 0;
      do {
        *(char *)((long)local_1838 + uVar8) = (char)uVar7;
        bVar11 = str[uVar8 + (long)(int)uVar6 + 1];
        uVar7 = (ulong)bVar11;
        uVar8 = uVar8 + 1;
        if (bVar11 == 0x2c) break;
      } while (bVar11 != 0);
      uVar6 = uVar6 + (int)uVar8;
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar6 = (bVar11 == 0x2c) + uVar6;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  NJDNode_set_chain_rule(node,(char *)local_1838);
  cVar1 = str[(int)uVar6];
  uVar7 = 0;
  if ((cVar1 != '\0') && (cVar1 != ',')) {
    uVar7 = 0;
    do {
      *(char *)((long)local_1838 + uVar7) = cVar1;
      cVar1 = str[uVar7 + (long)(int)uVar6 + 1];
      uVar7 = uVar7 + 1;
      if (cVar1 == ',') break;
    } while (cVar1 != '\0');
    uVar7 = uVar7 & 0xffffffff;
  }
  *(undefined1 *)((long)local_1838 + uVar7) = 0;
  if (local_1838[0] == 0x31) {
    iVar3 = 1;
LAB_0016ee99:
    node->chain_flag = iVar3;
  }
  else if (local_1838[0] == 0x30) {
    iVar3 = 0;
    goto LAB_0016ee99;
  }
  pcVar4 = strchr((char *)local_1438,0x2a);
  if (pcVar4 == (char *)0x0) {
    __s = local_1438;
    pcVar4 = strchr((char *)__s,0x2f);
    if (pcVar4 != (char *)0x0) {
      iVar3 = 0;
      do {
        if (*__s == 0x2f) {
          iVar3 = iVar3 + 1;
        }
        else if (*__s == 0) goto LAB_0016ef48;
        __s = __s + 1;
      } while( true );
    }
  }
  NJDNode_set_string(node,local_438);
  NJDNode_set_orig(node,(char *)local_838);
  NJDNode_set_read(node,(char *)local_c38);
  NJDNode_set_pron(node,(char *)local_1038);
  node->acc = 0;
code_r0x0016eefa:
  node->mora_size = 0;
  return;
LAB_0016ef48:
  if (iVar3 != 1) {
    if (iVar3 < 1) {
      return;
    }
    local_183c = 0;
    iVar10 = 0;
    iVar9 = 0;
    local_1844 = 0;
    local_1848 = 0;
    local_1840 = 0;
    node2 = (NJDNode *)0x0;
    do {
      if (iVar10 != 0) {
        node = (NJDNode *)calloc(1,0x78);
        node->string = (char *)0x0;
        node->pos = (char *)0x0;
        node->pos_group1 = (char *)0x0;
        node->pos_group2 = (char *)0x0;
        node->pos_group3 = (char *)0x0;
        node->ctype = (char *)0x0;
        node->cform = (char *)0x0;
        node->orig = (char *)0x0;
        node->read = (char *)0x0;
        node->pron = (char *)0x0;
        node->acc = 0;
        node->mora_size = 0;
        node->chain_rule = (char *)0x0;
        node->chain_flag = -1;
        node->prev = (_NJDNode *)0x0;
        node->next = (_NJDNode *)0x0;
        NJDNode_copy(node,node2);
        node->chain_flag = 0;
        node->prev = node2;
        node2->next = node;
      }
      bVar11 = local_838[local_1840];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0) {
        if (bVar11 == 0x3a) {
          uVar7 = 0;
          bVar11 = 0x3a;
        }
        else {
          uVar8 = 0;
          do {
            *(char *)((long)local_1838 + uVar8) = (char)uVar7;
            bVar11 = local_838[uVar8 + (long)local_1840 + 1];
            uVar7 = (ulong)bVar11;
            uVar8 = uVar8 + 1;
            if (bVar11 == 0x3a) break;
          } while (bVar11 != 0);
          local_1840 = local_1840 + (int)uVar8;
          uVar7 = uVar8 & 0xffffffff;
        }
        local_1840 = local_1840 + (uint)(bVar11 == 0x3a);
      }
      *(char *)((long)local_1838 + uVar7) = '\0';
      NJDNode_set_orig(node,(char *)local_1838);
      iVar10 = iVar10 + 1;
      if (iVar10 < iVar3) {
        NJDNode_set_string(node,(char *)local_1838);
        sVar5 = strlen((char *)local_1838);
        local_183c = local_183c + (int)sVar5;
      }
      else {
        NJDNode_set_string(node,local_438 + local_183c);
      }
      bVar11 = local_c38[local_1848];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0) {
        if (bVar11 == 0x3a) {
          uVar7 = 0;
          bVar11 = 0x3a;
        }
        else {
          uVar8 = 0;
          do {
            *(char *)((long)local_1838 + uVar8) = (char)uVar7;
            bVar11 = local_c38[uVar8 + (long)local_1848 + 1];
            uVar7 = (ulong)bVar11;
            uVar8 = uVar8 + 1;
            if (bVar11 == 0x3a) break;
          } while (bVar11 != 0);
          local_1848 = local_1848 + (int)uVar8;
          uVar7 = uVar8 & 0xffffffff;
        }
        local_1848 = local_1848 + (uint)(bVar11 == 0x3a);
      }
      *(undefined1 *)((long)local_1838 + uVar7) = 0;
      NJDNode_set_read(node,(char *)local_1838);
      bVar11 = local_1038[local_1844];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0) {
        if (bVar11 == 0x3a) {
          uVar7 = 0;
          bVar11 = 0x3a;
        }
        else {
          uVar8 = 0;
          do {
            *(char *)((long)local_1838 + uVar8) = (char)uVar7;
            bVar11 = local_1038[uVar8 + (long)local_1844 + 1];
            uVar7 = (ulong)bVar11;
            uVar8 = uVar8 + 1;
            if (bVar11 == 0x3a) break;
          } while (bVar11 != 0);
          local_1844 = local_1844 + (int)uVar8;
          uVar7 = uVar8 & 0xffffffff;
        }
        local_1844 = local_1844 + (uint)(bVar11 == 0x3a);
      }
      *(undefined1 *)((long)local_1838 + uVar7) = 0;
      NJDNode_set_pron(node,(char *)local_1838);
      bVar11 = local_1438[iVar9];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0) {
        if (bVar11 == 0x2f) {
          uVar7 = 0;
          bVar11 = 0x2f;
        }
        else {
          uVar8 = 0;
          do {
            *(char *)((long)local_1838 + uVar8) = (char)uVar7;
            bVar11 = local_1438[uVar8 + (long)iVar9 + 1];
            uVar7 = (ulong)bVar11;
            uVar8 = uVar8 + 1;
            if (bVar11 == 0x2f) break;
          } while (bVar11 != 0);
          iVar9 = iVar9 + (int)uVar8;
          uVar7 = uVar8 & 0xffffffff;
        }
        iVar9 = iVar9 + (uint)(bVar11 == 0x2f);
      }
      *(undefined1 *)((long)local_1838 + uVar7) = 0;
      if ((char)local_1838[0] == '\0') {
        NJDNode_load_cold_1();
        iVar2 = 0;
      }
      else {
        iVar2 = atoi((char *)local_1838);
      }
      node->acc = iVar2;
      if (iVar2 < 0) {
        NJDNode_load_cold_2();
      }
      bVar11 = local_1438[iVar9];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0) {
        if (bVar11 == 0x3a) {
          uVar7 = 0;
          bVar11 = 0x3a;
        }
        else {
          uVar8 = 0;
          do {
            *(char *)((long)local_1838 + uVar8) = (char)uVar7;
            bVar11 = local_1438[uVar8 + (long)iVar9 + 1];
            uVar7 = (ulong)bVar11;
            uVar8 = uVar8 + 1;
            if (bVar11 == 0x3a) break;
          } while (bVar11 != 0);
          iVar9 = iVar9 + (int)uVar8;
          uVar7 = uVar8 & 0xffffffff;
        }
        iVar9 = iVar9 + (uint)(bVar11 == 0x3a);
      }
      *(undefined1 *)((long)local_1838 + uVar7) = 0;
      if ((char)local_1838[0] == '\0') {
        NJDNode_load_cold_3();
        iVar2 = 0;
      }
      else {
        iVar2 = atoi((char *)local_1838);
      }
      node->mora_size = iVar2;
      if (iVar2 < 0) {
        NJDNode_load_cold_4();
      }
      node2 = node;
      if (iVar10 == iVar3) {
        return;
      }
    } while( true );
  }
  NJDNode_set_string(node,local_438);
  NJDNode_set_orig(node,(char *)local_838);
  NJDNode_set_read(node,(char *)local_c38);
  NJDNode_set_pron(node,(char *)local_1038);
  uVar8 = (ulong)local_1438[0];
  uVar7 = uVar8;
  if (local_1438[0] != 0) {
    uVar7 = 0;
    if (local_1438[0] == 0x2f) {
      uVar8 = 0;
      bVar11 = 0x2f;
    }
    else {
      do {
        *(char *)((long)local_1838 + uVar7) = (char)uVar8;
        bVar11 = local_1438[uVar7 + 1];
        uVar8 = (ulong)bVar11;
        uVar7 = uVar7 + 1;
        if (bVar11 == 0x2f) break;
      } while (bVar11 != 0);
      uVar8 = uVar7 & 0xffffffff;
    }
    uVar7 = (long)(int)((uint)(bVar11 == 0x2f) + (int)uVar7);
  }
  *(undefined1 *)((long)local_1838 + uVar8) = 0;
  if ((char)local_1838[0] == '\0') {
    NJDNode_load_cold_5();
    iVar3 = 0;
  }
  else {
    iVar3 = atoi((char *)local_1838);
  }
  node->acc = iVar3;
  if (iVar3 < 0) {
    NJDNode_load_cold_6();
  }
  bVar11 = local_1438[uVar7];
  uVar8 = 0;
  if ((bVar11 != 0) && (bVar11 != 0x3a)) {
    uVar8 = 0;
    do {
      *(byte *)((long)local_1838 + uVar8) = bVar11;
      bVar11 = local_1438[uVar8 + uVar7 + 1];
      uVar8 = uVar8 + 1;
      if (bVar11 == 0x3a) break;
    } while (bVar11 != 0);
    uVar8 = uVar8 & 0xffffffff;
  }
  *(undefined1 *)((long)local_1838 + uVar8) = 0;
  if ((char)local_1838[0] == '\0') {
    NJDNode_load_cold_7();
    iVar3 = 0;
  }
  else {
    iVar3 = atoi((char *)local_1838);
  }
  node->mora_size = iVar3;
  if (-1 < iVar3) {
    return;
  }
  NJDNode_load_cold_8();
  goto code_r0x0016eefa;
}

Assistant:

void NJDNode_load(NJDNode * node, const char *str)
{
   int i, j;
   int index = 0;
   char buff[MAXBUFLEN];
   char buff_string[MAXBUFLEN];
   char buff_orig[MAXBUFLEN];
   char buff_read[MAXBUFLEN];
   char buff_pron[MAXBUFLEN];
   char buff_acc[MAXBUFLEN];
   int count;
   int index_string;
   int index_orig;
   int index_read;
   int index_pron;
   int index_acc;
   NJDNode *prev = NULL;

   /* load */
   get_token_from_string(str, &index, buff_string, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group1(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group2(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group3(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_ctype(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_cform(node, buff);
   get_token_from_string(str, &index, buff_orig, ',');
   get_token_from_string(str, &index, buff_read, ',');
   get_token_from_string(str, &index, buff_pron, ',');
   get_token_from_string(str, &index, buff_acc, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_chain_rule(node, buff);
   get_token_from_string(str, &index, buff, ',');
   if (strcmp(buff, "1") == 0)
      NJDNode_set_chain_flag(node, 1);
   else if (strcmp(buff, "0") == 0)
      NJDNode_set_chain_flag(node, 0);

   /* for symbol */
   if (strstr(buff_acc, "*") != NULL || strstr(buff_acc, "/") == NULL) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      NJDNode_set_acc(node, 0);
      NJDNode_set_mora_size(node, 0);
      return;
   }

   /* count chained word */
   for (i = 0, count = 0; buff_acc[i] != '\0'; i++)
      if (buff_acc[i] == '/')
         count++;

   /* for single word */
   if (count == 1) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      index_acc = 0;
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      return;
   }

   /* parse chained word */
   index_string = 0;
   index_orig = 0;
   index_read = 0;
   index_pron = 0;
   index_acc = 0;
   for (i = 0; i < count; i++) {
      if (i > 0) {
         node = (NJDNode *) calloc(1, sizeof(NJDNode));
         NJDNode_initialize(node);
         NJDNode_copy(node, prev);
         NJDNode_set_chain_flag(node, 0);
         node->prev = prev;
         prev->next = node;
      }
      /* orig */
      get_token_from_string(buff_orig, &index_orig, buff, ':');
      NJDNode_set_orig(node, buff);
      /* string */
      if (i + 1 < count) {
         NJDNode_set_string(node, buff);
         index_string += strlen(buff);
      } else {
         NJDNode_set_string(node, &buff_string[index_string]);
      }
      /* read */
      get_token_from_string(buff_read, &index_read, buff, ':');
      NJDNode_set_read(node, buff);
      /* pron */
      get_token_from_string(buff_pron, &index_pron, buff, ':');
      NJDNode_set_pron(node, buff);
      /* acc */
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      /* mora size */
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      prev = node;
   }
}